

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemImpl.cpp
# Opt level: O3

string * efsw::Platform::System::getProcessPath_abi_cxx11_(void)

{
  long lVar1;
  ssize_t sVar2;
  char *pcVar3;
  long *plVar4;
  size_type *psVar5;
  string *in_RDI;
  char exe_file [4097];
  allocator local_1039;
  undefined1 *local_1038 [2];
  undefined1 local_1028 [16];
  char local_1018 [4104];
  
  sVar2 = readlink("/proc/self/exe",local_1018,0x1000);
  if ((int)(uint)sVar2 < 0) {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char_const*>();
  }
  else {
    local_1018[(uint)sVar2 & 0x7fffffff] = '\0';
    pcVar3 = dirname(local_1018);
    std::__cxx11::string::string((string *)local_1038,pcVar3,&local_1039);
    plVar4 = (long *)std::__cxx11::string::append((char *)local_1038);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar5) {
      lVar1 = plVar4[3];
      (in_RDI->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&in_RDI->field_2 + 8) = lVar1;
    }
    else {
      (in_RDI->_M_dataplus)._M_p = (pointer)*plVar4;
      (in_RDI->field_2)._M_allocated_capacity = *psVar5;
    }
    in_RDI->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_1038[0] != local_1028) {
      operator_delete(local_1038[0]);
    }
  }
  return in_RDI;
}

Assistant:

std::string System::getProcessPath() {
#if EFSW_OS == EFSW_OS_MACOSX
	char exe_file[FILENAME_MAX + 1];

	CFBundleRef mainBundle = CFBundleGetMainBundle();

	if ( mainBundle ) {
		CFURLRef mainURL = CFBundleCopyBundleURL( mainBundle );

		if ( mainURL ) {
			int ok = CFURLGetFileSystemRepresentation( mainURL, ( Boolean ) true, (UInt8*)exe_file,
													   FILENAME_MAX );

			if ( ok ) {
				return std::string( exe_file ) + "/";
			}
		}
	}

	return "./";
#elif EFSW_OS == EFSW_OS_LINUX
	char exe_file[FILENAME_MAX + 1];

	int size;

	size = readlink( "/proc/self/exe", exe_file, FILENAME_MAX );

	if ( size < 0 ) {
		return std::string( "./" );
	} else {
		exe_file[size] = '\0';
		return std::string( dirname( exe_file ) ) + "/";
	}

#elif EFSW_OS == EFSW_OS_BSD
	int mib[4];
	mib[0] = CTL_KERN;
	mib[1] = KERN_PROC;
	mib[2] = KERN_PROC_PATHNAME;
	mib[3] = -1;
	char buf[1024];
	size_t cb = sizeof( buf );
	sysctl( mib, 4, buf, &cb, NULL, 0 );

	return FileSystem::pathRemoveFileName( std::string( buf ) );

#elif EFSW_OS == EFSW_OS_SOLARIS
	return FileSystem::pathRemoveFileName( std::string( getexecname() ) );

#elif EFSW_OS == EFSW_OS_HAIKU
	image_info info;
	int32 cookie = 0;

	while ( B_OK == get_next_image_info( 0, &cookie, &info ) ) {
		if ( info.type == B_APP_IMAGE )
			break;
	}

	return FileSystem::pathRemoveFileName( std::string( info.name ) );

#elif EFSW_OS == EFSW_OS_ANDROID
	return "/sdcard/";

#else
#warning getProcessPath() not implemented on this platform. ( will return "./" )
	return "./";

#endif
}